

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlBase64.c
# Opt level: O3

JL_STATUS JlBase64Decode(char *Base64String,void **pData,size_t *pDataSize)

{
  byte bVar1;
  JL_STATUS JVar2;
  void *Memory;
  ulong uVar3;
  char *FourCharBlock;
  long lVar4;
  ulong uVar5;
  long lVar6;
  char charBlock [5];
  byte local_5b;
  byte local_5a;
  byte local_59;
  size_t *local_58;
  size_t local_50;
  size_t local_48;
  ulong local_40;
  uint local_38;
  undefined1 local_34;
  
  JVar2 = JL_STATUS_INVALID_PARAMETER;
  if (pDataSize != (size_t *)0x0 && (pData != (void **)0x0 && Base64String != (char *)0x0)) {
    *pData = (void *)0x0;
    *pDataSize = 0;
    for (uVar3 = 0; (bVar1 = Base64String[uVar3], bVar1 != 0 && (bVar1 != 0x3d)); uVar3 = uVar3 + 1)
    {
      if ((0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) && (bVar1 != 0x2b && 10 < (byte)(bVar1 - 0x2f))) {
        return JL_STATUS_INVALID_DATA;
      }
    }
    uVar5 = uVar3 >> 2;
    local_40 = (ulong)((uint)uVar3 & 3);
    local_50 = 0;
    if (local_40 != 0) {
      local_50 = local_40 - 1;
    }
    local_48 = uVar5 * 3 + local_50;
    Memory = WjTestLib_Calloc(local_48,1);
    if (Memory == (void *)0x0) {
      JVar2 = JL_STATUS_OUT_OF_MEMORY;
    }
    else {
      local_58 = pDataSize;
      if (uVar3 < 4) {
        lVar4 = 0;
      }
      else {
        lVar6 = uVar5 + (uVar5 == 0);
        lVar4 = 0;
        FourCharBlock = Base64String;
        do {
          Decode4Base64ToBytes(FourCharBlock,(uint8_t *)(lVar4 + (long)Memory));
          lVar4 = lVar4 + 3;
          FourCharBlock = FourCharBlock + 4;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      if ((uint)local_40 < 2) {
        if (local_40 != 0) {
          WjTestLib_Free(Memory);
          return JL_STATUS_INVALID_DATA;
        }
      }
      else {
        local_34 = 0;
        local_38 = 0x41414141;
        memcpy(&local_38,Base64String + (uVar3 & 0xfffffffffffffffc),local_40);
        local_5b = ""[local_38 >> 8 & 0x7f] >> 4 | ""[local_38 & 0x7f] << 2;
        local_5a = ""[local_38 >> 0x10 & 0x7f] >> 2 | ""[local_38 >> 8 & 0x7f] << 4;
        local_59 = ""[local_38 >> 0x10 & 0x7f] << 6 | ""[local_38 >> 0x18 & 0x7f];
        memcpy((void *)((long)Memory + lVar4),&local_5b,local_50);
      }
      *pData = Memory;
      *local_58 = local_48;
      JVar2 = JL_STATUS_SUCCESS;
    }
  }
  return JVar2;
}

Assistant:

JL_STATUS
    JlBase64Decode
    (
        char const*         Base64String,
        void**              pData,
        size_t*             pDataSize
    )
{
    JL_STATUS jlStatus;
    size_t base64Length = 0;

    if(     NULL != Base64String
        &&  NULL != pData
        &&  NULL != pDataSize )
    {
        *pData = NULL;
        *pDataSize = 0;

        // Get length of string by looking for a zero terminator OR a padding character.
        // Also validate every character is base64
        jlStatus = JL_STATUS_SUCCESS;
        while( 0 != Base64String[base64Length] && '=' != Base64String[base64Length] )
        {
            const char ch = Base64String[base64Length];
            if(     ( ch >= 'A' && ch <= 'Z' )
                ||  ( ch >= 'a' && ch <= 'z' )
                ||  ( ch >= '0' && ch <= '9' )
                ||  ( '+' == ch )
                ||  ( '/' == ch ) )
            {
                base64Length += 1;
            }
            else
            {
                jlStatus = JL_STATUS_INVALID_DATA;
                break;
            }
        }

        if( JL_STATUS_SUCCESS == jlStatus )
        {
            size_t numCompleteBlocks = base64Length / 4;
            size_t numTrailingChars = base64Length % 4;
            size_t numExtraBytes = 0;

            // Calculate size of output
            size_t dataSize = numCompleteBlocks * 3;
            if( numTrailingChars > 0 )
            {
                numExtraBytes = numTrailingChars - 1;
                dataSize += numExtraBytes;
            }

            uint8_t* data = JlAlloc( dataSize );
            if( NULL != data )
            {
                // Process in blocks of 4 characters forming 3 bytes
                size_t outIndex = 0;
                for( size_t blockIndex=0; blockIndex<numCompleteBlocks; blockIndex+=1 )
                {
                    Decode4Base64ToBytes( Base64String + (blockIndex*4), data + outIndex );
                    outIndex += 3;
                }

                if( numExtraBytes > 0 )
                {
                    // Process the final partial block
                    char charBlock[5] = "AAAA";
                    uint8_t byteBlock[3] = {0};
                    for( size_t i=0; i<numTrailingChars; i++ )
                    {
                        charBlock[i] = Base64String[ (numCompleteBlocks*4) + i ];
                    }
                    Decode4Base64ToBytes( charBlock, byteBlock );

                    // Now copy out the required number of bytes
                    for( size_t i=0; i<numExtraBytes; i++ )
                    {
                        data[outIndex] = byteBlock[i];
                        outIndex += 1;
                    }
                }
                else if( numTrailingChars > 0 && 0 == numExtraBytes )
                {
                    // This occurs if there is 1 character in the trailing block. This only represents 6 bits
                    // and therefore not a complete byte, so the data is truncated. So we report this as corrupt
                    jlStatus = JL_STATUS_INVALID_DATA;
                }

                if( JL_STATUS_SUCCESS == jlStatus )
                {
                    *pData = data;
                    *pDataSize = dataSize;
                }
                else
                {
                    JlFree( data );
                }
            }
            else
            {
                jlStatus = JL_STATUS_OUT_OF_MEMORY;
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}